

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationiterator.cpp
# Opt level: O0

int32_t __thiscall
icu_63::CollationIterator::fetchCEs(CollationIterator *this,UErrorCode *errorCode)

{
  UBool UVar1;
  int64_t iVar2;
  bool bVar3;
  UErrorCode *errorCode_local;
  CollationIterator *this_local;
  
  while( true ) {
    UVar1 = ::U_SUCCESS(*errorCode);
    bVar3 = false;
    if (UVar1 != '\0') {
      iVar2 = nextCE(this,errorCode);
      bVar3 = iVar2 != 0x101000100;
    }
    if (!bVar3) break;
    this->cesIndex = (this->ceBuffer).length;
  }
  return (this->ceBuffer).length;
}

Assistant:

int32_t
CollationIterator::fetchCEs(UErrorCode &errorCode) {
    while(U_SUCCESS(errorCode) && nextCE(errorCode) != Collation::NO_CE) {
        // No need to loop for each expansion CE.
        cesIndex = ceBuffer.length;
    }
    return ceBuffer.length;
}